

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

void __thiscall GlobOptBlockData::InitBlockData(GlobOptBlockData *this,GlobOpt *globOpt,Func *func)

{
  JitArenaAllocator *allocator;
  bool bVar1;
  ValueHashTable<Sym_*,_Value_*> *pVVar2;
  ValueHashTable<ExprHash,_Value_*> *pVVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_01;
  BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_02;
  
  this->globOpt = globOpt;
  allocator = globOpt->alloc;
  pVVar2 = ValueHashTable<Sym_*,_Value_*>::New(allocator,0x40);
  this->symToValueMap = pVVar2;
  pVVar3 = ValueHashTable<ExprHash,_Value_*>::New(allocator,0x40);
  this->exprToValueMap = pVVar3;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
  pBVar4->head = (Type_conflict)0x0;
  pBVar4->lastFoundIndex = (Type_conflict)0x0;
  pBVar4->alloc = allocator;
  pBVar4->lastUsedNodePrevNextField = (Type)pBVar4;
  this->liveFields = pBVar4;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
  pBVar4->head = (Type_conflict)0x0;
  pBVar4->lastFoundIndex = (Type_conflict)0x0;
  pBVar4->alloc = allocator;
  pBVar4->lastUsedNodePrevNextField = (Type)pBVar4;
  this->liveArrayValues = pBVar4;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
  pBVar4->head = (Type_conflict)0x0;
  pBVar4->lastFoundIndex = (Type_conflict)0x0;
  pBVar4->alloc = allocator;
  pBVar4->lastUsedNodePrevNextField = (Type)pBVar4;
  this->isTempSrc = pBVar4;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
  pBVar4->head = (Type_conflict)0x0;
  pBVar4->lastFoundIndex = (Type_conflict)0x0;
  pBVar4->alloc = allocator;
  pBVar4->lastUsedNodePrevNextField = (Type)pBVar4;
  this->liveVarSyms = pBVar4;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
  pBVar4->head = (Type_conflict)0x0;
  pBVar4->lastFoundIndex = (Type_conflict)0x0;
  pBVar4->alloc = allocator;
  pBVar4->lastUsedNodePrevNextField = (Type)pBVar4;
  this->liveInt32Syms = pBVar4;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
  pBVar4->head = (Type_conflict)0x0;
  pBVar4->lastFoundIndex = (Type_conflict)0x0;
  pBVar4->alloc = allocator;
  pBVar4->lastUsedNodePrevNextField = (Type)pBVar4;
  this->liveLossyInt32Syms = pBVar4;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
  pBVar4->head = (Type_conflict)0x0;
  pBVar4->lastFoundIndex = (Type_conflict)0x0;
  pBVar4->alloc = allocator;
  pBVar4->lastUsedNodePrevNextField = (Type)pBVar4;
  this->liveFloat64Syms = pBVar4;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
  pBVar4->head = (Type_conflict)0x0;
  pBVar4->lastFoundIndex = (Type_conflict)0x0;
  pBVar4->alloc = allocator;
  pBVar4->lastUsedNodePrevNextField = (Type)pBVar4;
  this->argObjSyms = pBVar4;
  this->maybeTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->canStoreTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this_00 = (BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::JitArenaAllocator>(0x38,allocator,0x3d6ef4);
  JsUtil::
  BaseDictionary<Value_*,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(this_00,allocator,0);
  this->valuesToKillOnCalls = (ValueSet *)this_00;
  bVar1 = GlobOpt::DoBoundCheckHoist(this->globOpt);
  if (bVar1) {
    if (this->globOpt->prePassLoop == (Loop *)0x0) {
      this_01 = (BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)0x0;
    }
    else {
      this_01 = (BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::JitArenaAllocator>(0x38,allocator,0x3d6ef4);
      JsUtil::
      BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_01,allocator,0);
    }
    this->inductionVariables = (InductionVariableSet *)this_01;
    this_02 = (BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *)new<Memory::JitArenaAllocator>(0x38,allocator,0x3d6ef4);
    JsUtil::
    BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_02,allocator,0);
    this->availableIntBoundChecks = (IntBoundCheckSet *)this_02;
  }
  this->maybeWrittenTypeSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->callSequence = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->stackLiteralInitFldDataMap = (StackLiteralInitFldDataMap *)0x0;
  this->startCallCount = 0;
  this->argOutCount = 0;
  this->totalOutParamCount = 0;
  this->inlinedArgOutSize = 0;
  this->hasCSECandidates = false;
  this->curFunc = func;
  pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,allocator,0x3d6ef4);
  pBVar4->head = (Type_conflict)0x0;
  pBVar4->lastFoundIndex = (Type_conflict)0x0;
  pBVar4->alloc = allocator;
  pBVar4->lastUsedNodePrevNextField = (Type)pBVar4;
  this->changedSyms = pBVar4;
  OnDataInitialized(this,allocator);
  return;
}

Assistant:

void
GlobOptBlockData::InitBlockData(GlobOpt* globOpt, Func* func)
{
    this->globOpt = globOpt;

    JitArenaAllocator *const alloc = this->globOpt->alloc;

    this->symToValueMap = GlobHashTable::New(alloc, 64);
    this->exprToValueMap = ExprHashTable::New(alloc, 64);
    this->liveFields = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveArrayValues = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->isTempSrc = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveVarSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveLossyInt32Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->liveFloat64Syms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->argObjSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    this->maybeTempObjectSyms = nullptr;
    this->canStoreTempObjectSyms = nullptr;
    this->valuesToKillOnCalls = JitAnew(alloc, ValueSet, alloc);

    if(this->globOpt->DoBoundCheckHoist())
    {
        this->inductionVariables = this->globOpt->IsLoopPrePass() ? JitAnew(alloc, InductionVariableSet, alloc) : nullptr;
        this->availableIntBoundChecks = JitAnew(alloc, IntBoundCheckSet, alloc);
    }

    this->maybeWrittenTypeSyms = nullptr;
    this->callSequence = nullptr;
    this->startCallCount = 0;
    this->argOutCount = 0;
    this->totalOutParamCount = 0;
    this->inlinedArgOutSize = 0;
    this->hasCSECandidates = false;
    this->curFunc = func;

    this->stackLiteralInitFldDataMap = nullptr;

    this->changedSyms = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);

    this->OnDataInitialized(alloc);
}